

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

Am_Value_List __thiscall Am_Value_List::Copy(Am_Value_List *this)

{
  Am_Value_List_Data *this_00;
  Am_List_Item *extraout_RDX;
  Am_List_Item *extraout_RDX_00;
  Am_List_Item *pAVar1;
  long *in_RSI;
  Am_Value_List AVar2;
  Am_Value_List *this_local;
  
  if (*in_RSI == 0) {
    Am_Value_List(this,&Am_No_Value_List);
    pAVar1 = extraout_RDX_00;
  }
  else {
    this_00 = (Am_Value_List_Data *)operator_new(0x20);
    Am_Value_List_Data::Am_Value_List_Data(this_00,(Am_Value_List_Data *)*in_RSI);
    Am_Value_List(this,this_00);
    pAVar1 = extraout_RDX;
  }
  AVar2.item = pAVar1;
  AVar2.data = (Am_Value_List_Data *)this;
  return AVar2;
}

Assistant:

Am_Value_List
Am_Value_List::Copy()
{
  if (data)
    return Am_Value_List(new Am_Value_List_Data(data));
  else
    return Am_No_Value_List;
}